

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

void __thiscall
sisl::array_n<float,_3,_std::allocator<float>_>::array_n
          (array_n<float,_3,_std::allocator<float>_> *this,uint d0,...)

{
  uint uVar1;
  char in_AL;
  float *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar2;
  void **ppvVar3;
  ulong uVar4;
  void **ppvVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  uint local_e8;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  ppvVar3 = &vl[0].overflow_arg_area;
  this->_dims[0] = d0;
  local_e8 = 0x10;
  lVar2 = 3;
  do {
    if (local_e8 < 0x29) {
      uVar4 = (ulong)local_e8;
      local_e8 = local_e8 + 8;
      ppvVar5 = (void **)((long)local_c8 + uVar4);
    }
    else {
      ppvVar5 = ppvVar3;
      ppvVar3 = ppvVar3 + 1;
    }
    uVar1 = *(uint *)ppvVar5;
    this->_dims[lVar2 + -2] = uVar1;
    d0 = d0 * uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  if (d0 == 0) {
    __s = (float *)0x0;
  }
  else {
    uVar4 = (ulong)d0;
    local_c8[2] = (void *)in_RDX;
    local_c8[3] = (void *)in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    __s = __gnu_cxx::new_allocator<float>::allocate((new_allocator<float> *)this,uVar4,(void *)0x0);
    this->first = __s;
    memset(__s,0,uVar4 * 4);
    this->last = __s + uVar4;
  }
  this->_array = __s;
  return;
}

Assistant:

array_n(unsigned int d0, ...) {
            unsigned int n = d0;
            size_type i;

            // Start with d0
            va_list vl;
            va_start(vl, d0);

            _dims[0] = d0;

            for(int i = 1; i < N; i++) {
                _dims[i] = va_arg(vl, unsigned int);
                n *= _dims[i];
            }
            va_end(vl);
            _alloc(n);
#ifdef SISL_CL
            _onDevice = false;
            _deviceMemory = nullptr;
#endif
        }